

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O1

ForStatement * __thiscall SQASTReader::readForStatement(SQASTReader *this)

{
  ForStatement *pFVar1;
  Node *pNVar2;
  Expr *pEVar3;
  Expr *pEVar4;
  Statement *pSVar5;
  Chunk *pCVar6;
  
  pNVar2 = readNullable(this);
  pEVar3 = readNullableExpression(this);
  pEVar4 = readNullableExpression(this);
  pSVar5 = readNullableStatement(this);
  pCVar6 = Arena::findChunk(this->astArena,0x40);
  pFVar1 = (ForStatement *)pCVar6->_ptr;
  pCVar6->_ptr = (uint8_t *)(pFVar1 + 1);
  (pFVar1->super_LoopStatement).super_Statement.super_Node._op = TO_FOR;
  (pFVar1->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart = -1;
  (pFVar1->super_LoopStatement).super_Statement.super_Node._coordinates.columnStart = -1;
  (pFVar1->super_LoopStatement).super_Statement.super_Node._coordinates.lineEnd = -1;
  (pFVar1->super_LoopStatement).super_Statement.super_Node._coordinates.columnEnd = -1;
  (pFVar1->super_LoopStatement)._body = pSVar5;
  (pFVar1->super_LoopStatement).super_Statement.super_Node.super_ArenaObj._vptr_ArenaObj =
       (_func_int **)&PTR__ArenaObj_001a4648;
  pFVar1->_init = pNVar2;
  pFVar1->_cond = pEVar3;
  pFVar1->_mod = pEVar4;
  return pFVar1;
}

Assistant:

ForStatement *SQASTReader::readForStatement() {
  Node *init = readNullable();
  Expr *condition = readNullableExpression();
  Expr *modifier = readNullableExpression();

  Statement *body = readNullableStatement();

  return newNode<ForStatement>(init, condition, modifier, body);
}